

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

Uint8 Scancode20to12(SDL_Scancode sc)

{
  Uint8 local_9;
  SDL_Scancode sc_local;
  
  switch(sc) {
  case SDL_SCANCODE_A:
    local_9 = '&';
    break;
  case SDL_SCANCODE_B:
    local_9 = '8';
    break;
  case SDL_SCANCODE_C:
    local_9 = '6';
    break;
  case SDL_SCANCODE_D:
    local_9 = '(';
    break;
  case SDL_SCANCODE_E:
    local_9 = '\x1a';
    break;
  case SDL_SCANCODE_F:
    local_9 = ')';
    break;
  case SDL_SCANCODE_G:
    local_9 = '*';
    break;
  case SDL_SCANCODE_H:
    local_9 = '+';
    break;
  case SDL_SCANCODE_I:
    local_9 = '\x1f';
    break;
  case SDL_SCANCODE_J:
    local_9 = ',';
    break;
  case SDL_SCANCODE_K:
    local_9 = '-';
    break;
  case SDL_SCANCODE_L:
    local_9 = '.';
    break;
  case SDL_SCANCODE_M:
    local_9 = ':';
    break;
  case SDL_SCANCODE_N:
    local_9 = '9';
    break;
  case SDL_SCANCODE_O:
    local_9 = ' ';
    break;
  case SDL_SCANCODE_P:
    local_9 = '!';
    break;
  case SDL_SCANCODE_Q:
    local_9 = '\x18';
    break;
  case SDL_SCANCODE_R:
    local_9 = '\x1b';
    break;
  case SDL_SCANCODE_S:
    local_9 = '\'';
    break;
  case SDL_SCANCODE_T:
    local_9 = '\x1c';
    break;
  case SDL_SCANCODE_U:
    local_9 = '\x1e';
    break;
  case SDL_SCANCODE_V:
    local_9 = '7';
    break;
  case SDL_SCANCODE_W:
    local_9 = '\x19';
    break;
  case SDL_SCANCODE_X:
    local_9 = '5';
    break;
  case SDL_SCANCODE_Y:
    local_9 = '\x1d';
    break;
  case SDL_SCANCODE_Z:
    local_9 = '4';
    break;
  case SDL_SCANCODE_1:
    local_9 = '\n';
    break;
  case SDL_SCANCODE_2:
    local_9 = '\v';
    break;
  case SDL_SCANCODE_3:
    local_9 = '\f';
    break;
  case SDL_SCANCODE_4:
    local_9 = '\r';
    break;
  case SDL_SCANCODE_5:
    local_9 = '\x0e';
    break;
  case SDL_SCANCODE_6:
    local_9 = '\x0f';
    break;
  case SDL_SCANCODE_7:
    local_9 = '\x10';
    break;
  case SDL_SCANCODE_8:
    local_9 = '\x11';
    break;
  case SDL_SCANCODE_9:
    local_9 = '\x12';
    break;
  case SDL_SCANCODE_0:
    local_9 = '\x13';
    break;
  case SDL_SCANCODE_RETURN:
    local_9 = '$';
    break;
  case SDL_SCANCODE_ESCAPE:
    local_9 = '\t';
    break;
  case SDL_SCANCODE_BACKSPACE:
    local_9 = '\x16';
    break;
  case SDL_SCANCODE_TAB:
    local_9 = '\x17';
    break;
  case SDL_SCANCODE_SPACE:
    local_9 = 'A';
    break;
  case SDL_SCANCODE_MINUS:
    local_9 = '\x14';
    break;
  case SDL_SCANCODE_EQUALS:
    local_9 = '\x15';
    break;
  case SDL_SCANCODE_LEFTBRACKET:
    local_9 = '\"';
    break;
  case SDL_SCANCODE_RIGHTBRACKET:
    local_9 = '#';
    break;
  case SDL_SCANCODE_BACKSLASH:
    local_9 = '3';
    break;
  default:
    local_9 = '\0';
    break;
  case SDL_SCANCODE_SEMICOLON:
    local_9 = '/';
    break;
  case SDL_SCANCODE_APOSTROPHE:
    local_9 = '0';
    break;
  case SDL_SCANCODE_GRAVE:
    local_9 = '1';
    break;
  case SDL_SCANCODE_COMMA:
    local_9 = ';';
    break;
  case SDL_SCANCODE_PERIOD:
    local_9 = '<';
    break;
  case SDL_SCANCODE_SLASH:
    local_9 = '=';
    break;
  case SDL_SCANCODE_CAPSLOCK:
    local_9 = 'B';
    break;
  case SDL_SCANCODE_F1:
    local_9 = 'C';
    break;
  case SDL_SCANCODE_F2:
    local_9 = 'D';
    break;
  case SDL_SCANCODE_F3:
    local_9 = 'E';
    break;
  case SDL_SCANCODE_F4:
    local_9 = 'F';
    break;
  case SDL_SCANCODE_F5:
    local_9 = 'G';
    break;
  case SDL_SCANCODE_F6:
    local_9 = 'H';
    break;
  case SDL_SCANCODE_F7:
    local_9 = 'I';
    break;
  case SDL_SCANCODE_F8:
    local_9 = 'J';
    break;
  case SDL_SCANCODE_F9:
    local_9 = 'K';
    break;
  case SDL_SCANCODE_F10:
    local_9 = 'L';
    break;
  case SDL_SCANCODE_F11:
    local_9 = '_';
    break;
  case SDL_SCANCODE_F12:
    local_9 = '`';
    break;
  case SDL_SCANCODE_PRINTSCREEN:
    local_9 = 'k';
    break;
  case SDL_SCANCODE_SCROLLLOCK:
    local_9 = 'N';
    break;
  case SDL_SCANCODE_INSERT:
    local_9 = '\0';
    break;
  case SDL_SCANCODE_HOME:
    local_9 = '\0';
    break;
  case SDL_SCANCODE_PAGEUP:
    local_9 = '\0';
    break;
  case SDL_SCANCODE_DELETE:
    local_9 = '\0';
    break;
  case SDL_SCANCODE_END:
    local_9 = '\0';
    break;
  case SDL_SCANCODE_PAGEDOWN:
    local_9 = '\0';
    break;
  case SDL_SCANCODE_RIGHT:
    local_9 = '\0';
    break;
  case SDL_SCANCODE_LEFT:
    local_9 = '\0';
    break;
  case SDL_SCANCODE_DOWN:
    local_9 = '\0';
    break;
  case SDL_SCANCODE_UP:
    local_9 = '\0';
    break;
  case SDL_SCANCODE_NUMLOCKCLEAR:
    local_9 = 'M';
    break;
  case SDL_SCANCODE_KP_DIVIDE:
    local_9 = '\0';
    break;
  case SDL_SCANCODE_KP_MULTIPLY:
    local_9 = '?';
    break;
  case SDL_SCANCODE_KP_MINUS:
    local_9 = 'R';
    break;
  case SDL_SCANCODE_KP_PLUS:
    local_9 = 'V';
    break;
  case SDL_SCANCODE_KP_ENTER:
    local_9 = '\0';
    break;
  case SDL_SCANCODE_KP_1:
    local_9 = 'W';
    break;
  case SDL_SCANCODE_KP_2:
    local_9 = 'X';
    break;
  case SDL_SCANCODE_KP_3:
    local_9 = 'Y';
    break;
  case SDL_SCANCODE_KP_4:
    local_9 = 'S';
    break;
  case SDL_SCANCODE_KP_5:
    local_9 = 'T';
    break;
  case SDL_SCANCODE_KP_6:
    local_9 = 'U';
    break;
  case SDL_SCANCODE_KP_7:
    local_9 = 'O';
    break;
  case SDL_SCANCODE_KP_8:
    local_9 = 'P';
    break;
  case SDL_SCANCODE_KP_9:
    local_9 = 'Q';
    break;
  case SDL_SCANCODE_KP_0:
    local_9 = 'Z';
    break;
  case SDL_SCANCODE_KP_PERIOD:
    local_9 = '[';
    break;
  case SDL_SCANCODE_NONUSBACKSLASH:
    local_9 = '^';
    break;
  case SDL_SCANCODE_KP_EQUALS:
    local_9 = '\0';
    break;
  case SDL_SCANCODE_LCTRL:
    local_9 = '%';
    break;
  case SDL_SCANCODE_LSHIFT:
    local_9 = '2';
    break;
  case SDL_SCANCODE_LALT:
    local_9 = '@';
    break;
  case SDL_SCANCODE_LGUI:
    local_9 = 0x85;
    break;
  case SDL_SCANCODE_RSHIFT:
    local_9 = '>';
    break;
  case SDL_SCANCODE_RGUI:
    local_9 = 0x86;
  }
  return local_9;
}

Assistant:

static Uint8
Scancode20to12(SDL_Scancode sc)
{
    /* SDL 1.2 scancodes are the actual raw scancodes (for the most part), and
       so differ wildly between different systems. Fortunately, this means
       they're rarely used, and often have fallbacks. Here, we support them
       for three systems: Win32, Mac OS X, and a synthesized pseudo-Linux that
       should work.
       Windows scancodes are bascially just Linux ones - 8. OS X has a totally
       different set of scancodes from everyone else. Linux's scancodes change
       depending on what driver you're using, but only really for a few keys.
       Since there are applications (DOSBox) which look this up and behave
       accordingly, but have fallbacks, those keys have scancodes of 0 here,
       to trigger the fallbacks. */
    switch(sc) {
#if defined(_WIN32)
#define CASESCANCODE20TO12(sc20, sc12, sc12mac) case SDL_SCANCODE_##sc20: return (sc12 ? (sc12 - 8) : 0)
#elif defined(__MACOSX__)
#define CASESCANCODE20TO12(sc20, sc12, sc12mac) case SDL_SCANCODE_##sc20: return sc12mac
#else
#define CASESCANCODE20TO12(sc20, sc12, sc12mac) case SDL_SCANCODE_##sc20: return sc12
#endif
    CASESCANCODE20TO12(0, 0x13, 0x1D);
    CASESCANCODE20TO12(1, 0x0A, 0x12);
    CASESCANCODE20TO12(2, 0x0B, 0x13);
    CASESCANCODE20TO12(3, 0x0C, 0x14);
    CASESCANCODE20TO12(4, 0x0D, 0x15);
    CASESCANCODE20TO12(5, 0x0E, 0x17);
    CASESCANCODE20TO12(6, 0x0F, 0x16);
    CASESCANCODE20TO12(7, 0x10, 0x1A);
    CASESCANCODE20TO12(8, 0x11, 0x1C);
    CASESCANCODE20TO12(9, 0x12, 0x19);
    CASESCANCODE20TO12(A, 0x26, 0x00);
    CASESCANCODE20TO12(APOSTROPHE, 0x30, 0x27);
    CASESCANCODE20TO12(B, 0x38, 0x0B);
    CASESCANCODE20TO12(BACKSLASH, 0x33, 0x2A);
    CASESCANCODE20TO12(BACKSPACE, 0x16, 0x33);
    CASESCANCODE20TO12(C, 0x36, 0x08);
    CASESCANCODE20TO12(CAPSLOCK, 0x42, 0x00);
    CASESCANCODE20TO12(COMMA, 0x3B, 0x2B);
    CASESCANCODE20TO12(D, 0x28, 0x02);
    CASESCANCODE20TO12(DELETE, 0x00, 0x75);
    CASESCANCODE20TO12(DOWN, 0x00, 0x7D);
    CASESCANCODE20TO12(E, 0x1A, 0x0E);
    CASESCANCODE20TO12(END, 0x00, 0x77);
    CASESCANCODE20TO12(EQUALS, 0x15, 0x18);
    CASESCANCODE20TO12(ESCAPE, 0x09, 0x35);
    CASESCANCODE20TO12(F, 0x29, 0x03);
    CASESCANCODE20TO12(F1, 0x43, 0x7A);
    CASESCANCODE20TO12(F10, 0x4C, 0x6E);
    CASESCANCODE20TO12(F11, 0x5F, 0x67);
    CASESCANCODE20TO12(F12, 0x60, 0x6F);
    CASESCANCODE20TO12(F2, 0x44, 0x78);
    CASESCANCODE20TO12(F3, 0x45, 0x63);
    CASESCANCODE20TO12(F4, 0x46, 0x76);
    CASESCANCODE20TO12(F5, 0x47, 0x60);
    CASESCANCODE20TO12(F6, 0x48, 0x61);
    CASESCANCODE20TO12(F7, 0x49, 0x62);
    CASESCANCODE20TO12(F8, 0x4A, 0x64);
    CASESCANCODE20TO12(F9, 0x4B, 0x65);
    CASESCANCODE20TO12(G, 0x2A, 0x05);
    CASESCANCODE20TO12(GRAVE, 0x31, 0x32); /* Note: the mac scancode might not be 100% correct, see below */
    CASESCANCODE20TO12(H, 0x2B, 0x04);
    CASESCANCODE20TO12(HOME, 0x00, 0x73);
    CASESCANCODE20TO12(I, 0x1F, 0x22);
    CASESCANCODE20TO12(INSERT, 0x00, 0x72);
    CASESCANCODE20TO12(J, 0x2C, 0x26);
    CASESCANCODE20TO12(K, 0x2D, 0x28);
    CASESCANCODE20TO12(KP_0, 0x5A, 0x52);
    CASESCANCODE20TO12(KP_1, 0x57, 0x53);
    CASESCANCODE20TO12(KP_2, 0x58, 0x54);
    CASESCANCODE20TO12(KP_3, 0x59, 0x55);
    CASESCANCODE20TO12(KP_4, 0x53, 0x56);
    CASESCANCODE20TO12(KP_5, 0x54, 0x57);
    CASESCANCODE20TO12(KP_6, 0x55, 0x58);
    CASESCANCODE20TO12(KP_7, 0x4F, 0x59);
    CASESCANCODE20TO12(KP_8, 0x50, 0x5B);
    CASESCANCODE20TO12(KP_9, 0x51, 0x5C);
    CASESCANCODE20TO12(KP_DIVIDE, 0x00, 0x4B);
    CASESCANCODE20TO12(KP_ENTER, 0x00, 0x4C);
    CASESCANCODE20TO12(KP_EQUALS, 0x00, 0x51);
    CASESCANCODE20TO12(KP_MINUS, 0x52, 0x4E);
    CASESCANCODE20TO12(KP_MULTIPLY, 0x3F, 0x43);
    CASESCANCODE20TO12(KP_PERIOD, 0x5B, 0x41);
    CASESCANCODE20TO12(KP_PLUS, 0x56, 0x45);
    CASESCANCODE20TO12(L, 0x2E, 0x25);
    CASESCANCODE20TO12(LALT, 0x40, 0x00);
    CASESCANCODE20TO12(LCTRL, 0x25, 0x00);
    CASESCANCODE20TO12(LEFT, 0x00, 0x7B);
    CASESCANCODE20TO12(LEFTBRACKET, 0x22, 0x21);
    CASESCANCODE20TO12(LGUI, 0x85, 0x00);
    CASESCANCODE20TO12(LSHIFT, 0x32, 0x00);
    CASESCANCODE20TO12(M, 0x3A, 0x2E);
    CASESCANCODE20TO12(MINUS, 0x14, 0x1B);
    CASESCANCODE20TO12(N, 0x39, 0x2D);
    /* On Macs with ANSI layout, 0x32 is SDL_SCANCODE_GRAVE and _NONUSBACKSLASH doesn't exist.
     * On Macs with ISO layout, 0x32 is _NONUSBACKSLASH and 0x0A is the key at the position of _GRAVE..
     * Probably it's best to keep _GRAVE at 0x32 and use 0x0A for _NONUSBACKSLASH instead,
     * so at least it has a unique scancode at all. */
    CASESCANCODE20TO12(NONUSBACKSLASH, 0x5E, 0x0A);
    CASESCANCODE20TO12(NUMLOCKCLEAR, 0x4D, 0x47);
    CASESCANCODE20TO12(O, 0x20, 0x1F);
    CASESCANCODE20TO12(P, 0x21, 0x23);
    CASESCANCODE20TO12(PAGEDOWN, 0x00, 0x79);
    CASESCANCODE20TO12(PAGEUP, 0x00, 0x74);
    CASESCANCODE20TO12(PERIOD, 0x3C, 0x2F);
    CASESCANCODE20TO12(PRINTSCREEN, 0x6B, 0x6B);
    CASESCANCODE20TO12(Q, 0x18, 0x0C);
    CASESCANCODE20TO12(R, 0x1B, 0x0F);
    CASESCANCODE20TO12(RETURN, 0x24, 0x24);
    CASESCANCODE20TO12(RGUI, 0x86, 0x00);
    CASESCANCODE20TO12(RIGHT, 0x00, 0x7C);
    CASESCANCODE20TO12(RIGHTBRACKET, 0x23, 0x1E);
    CASESCANCODE20TO12(RSHIFT, 0x3E, 0x00);
    CASESCANCODE20TO12(S, 0x27, 0x01);
    CASESCANCODE20TO12(SCROLLLOCK, 0x4E, 0x71);
    CASESCANCODE20TO12(SEMICOLON, 0x2F, 0x29);
    CASESCANCODE20TO12(SLASH, 0x3D, 0x2C);
    CASESCANCODE20TO12(SPACE, 0x41, 0x31);
    CASESCANCODE20TO12(T, 0x1C, 0x11);
    CASESCANCODE20TO12(TAB, 0x17, 0x30);
    CASESCANCODE20TO12(U, 0x1E, 0x20);
    CASESCANCODE20TO12(UP, 0x00, 0x7E);
    CASESCANCODE20TO12(V, 0x37, 0x09);
    CASESCANCODE20TO12(W, 0x19, 0x0D);
    CASESCANCODE20TO12(X, 0x35, 0x07);
    CASESCANCODE20TO12(Y, 0x1D, 0x10);
    CASESCANCODE20TO12(Z, 0x34, 0x06);
#undef CASESCANCODE20TO12
    default:
        /* If we don't know it, return 0, which is "unknown".
           It's also "a" on Mac OS X, but SDL 1.2 uses it as "unknown", too. */
        return 0;
    }
}